

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O3

void duckdb::MergeUpdateLoop<int>
               (UpdateInfo *base_info,Vector *base_data,UpdateInfo *update_info,
               UnifiedVectorFormat *update,row_t *ids,idx_t count,SelectionVector *sel)

{
  UpdateInfo *__dest;
  uint uVar1;
  uint uVar2;
  data_ptr_t pdVar3;
  sel_t *psVar4;
  SelectionVector *pSVar5;
  sel_t *psVar6;
  row_t rVar7;
  ulong uVar8;
  ulong uVar9;
  void *__dest_00;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  size_t __n;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  data_ptr_t pdVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  int result_values [2048];
  uint local_4038 [2048];
  undefined4 local_2038 [2050];
  
  lVar18 = base_info->vector_index * 0x800 + base_info->segment->column_data->start;
  __dest = base_info + 1;
  uVar15 = (ulong)base_info->max;
  uVar1 = update_info->max;
  lVar22 = (ulong)uVar1 * 4;
  if (count == 0) {
    uVar11 = (ulong)update_info->N;
    lVar13 = 0;
    uVar20 = 0;
  }
  else {
    pdVar3 = base_data->data;
    psVar4 = sel->sel_vector;
    uVar11 = (ulong)update_info->N;
    uVar19 = (ulong)base_info->N;
    uVar8 = 0;
    uVar20 = 0;
    uVar12 = 0;
    lVar13 = 0;
    do {
      uVar10 = uVar12;
      if (psVar4 != (sel_t *)0x0) {
        uVar10 = (ulong)psVar4[uVar12];
      }
      uVar10 = ids[uVar10] - lVar18;
      lVar21 = lVar13;
      if (uVar20 < uVar11) {
        lVar16 = 0;
        do {
          uVar2 = *(uint *)((long)&update_info[1].segment + lVar16 * 4 + uVar20 * 4);
          if (uVar10 <= uVar2) {
            lVar21 = lVar13 + lVar16;
            if (uVar10 != uVar2) {
              uVar20 = uVar20 + lVar16;
              goto LAB_010fc39a;
            }
            local_2038[lVar13 + lVar16] =
                 *(undefined4 *)((long)&update_info[1].segment + lVar16 * 4 + uVar20 * 4 + lVar22);
            local_4038[lVar13 + lVar16] = uVar2;
            uVar20 = uVar20 + lVar16 + 1;
            goto LAB_010fc3f1;
          }
          local_2038[lVar13 + lVar16] =
               *(undefined4 *)((long)&update_info[1].segment + lVar16 * 4 + uVar20 * 4 + lVar22);
          local_4038[lVar13 + lVar16] = uVar2;
          lVar16 = lVar16 + 1;
        } while ((uVar20 - uVar11) + lVar16 != 0);
        lVar21 = lVar13 + lVar16;
        uVar20 = uVar11;
      }
LAB_010fc39a:
      uVar9 = uVar8;
      if (uVar8 < uVar19) {
        lVar13 = uVar15 * -4 + uVar8 * -4;
        do {
          uVar14 = (ulong)*(uint *)((long)&__dest->segment + uVar8 * 4);
          if (uVar10 <= uVar14) {
            uVar9 = uVar8;
            if (uVar10 == uVar14) {
              pdVar17 = (data_ptr_t)((long)__dest - lVar13);
              goto LAB_010fc3de;
            }
            break;
          }
          uVar8 = uVar8 + 1;
          lVar13 = lVar13 + -4;
          uVar9 = uVar19;
        } while (uVar19 != uVar8);
      }
      pdVar17 = pdVar3 + uVar10 * 4;
      uVar8 = uVar9;
LAB_010fc3de:
      local_2038[lVar21] = *(undefined4 *)pdVar17;
      local_4038[lVar21] = (uint)uVar10;
LAB_010fc3f1:
      lVar13 = lVar21 + 1;
      uVar12 = uVar12 + 1;
    } while (uVar12 != count);
  }
  pSVar5 = update->sel;
  pdVar3 = update->data;
  if (uVar20 <= uVar11 && uVar11 - uVar20 != 0) {
    __n = (uVar11 - uVar20) * 4;
    switchD_015de399::default
              (local_2038 + lVar13,(void *)((long)&update_info[1].segment + lVar22 + uVar20 * 4),__n
              );
    switchD_015de399::default
              (local_4038 + lVar13,(void *)((long)&update_info[1].segment + uVar20 * 4),__n);
    lVar13 = (uVar11 + lVar13) - uVar20;
  }
  __dest_00 = (void *)((long)&base_info[1].segment + uVar15 * 4);
  update_info->N = (sel_t)lVar13;
  switchD_015de399::default
            ((void *)((long)&update_info[1].segment + (ulong)uVar1 * 4),local_2038,lVar13 << 2);
  switchD_015de399::default(update_info + 1,local_4038,lVar13 << 2);
  uVar20 = (ulong)base_info->N;
  psVar4 = sel->sel_vector;
  if (count == 0 || uVar20 == 0) {
    lVar22 = 0;
    uVar8 = 0;
    uVar11 = 0;
  }
  else {
    psVar6 = pSVar5->sel_vector;
    lVar22 = 0;
    uVar11 = 0;
    uVar8 = 0;
    do {
      uVar12 = uVar11;
      if (psVar4 != (sel_t *)0x0) {
        uVar12 = (ulong)psVar4[uVar11];
      }
      uVar19 = ids[uVar12] - lVar18;
      uVar1 = *(uint *)((long)&__dest->segment + uVar8 * 4);
      if (uVar19 == uVar1) {
        if (psVar6 != (sel_t *)0x0) {
          uVar12 = (ulong)psVar6[uVar12];
        }
        local_2038[lVar22] = *(undefined4 *)(pdVar3 + uVar12 * 4);
        local_4038[lVar22] = (uint)uVar19;
        uVar11 = uVar11 + 1;
LAB_010fc59e:
        uVar8 = uVar8 + 1;
      }
      else {
        if (uVar1 <= uVar19) {
          local_2038[lVar22] = *(undefined4 *)((long)__dest_00 + uVar8 * 4);
          local_4038[lVar22] = uVar1;
          goto LAB_010fc59e;
        }
        if (psVar6 != (sel_t *)0x0) {
          uVar12 = (ulong)psVar6[uVar12];
        }
        local_2038[lVar22] = *(undefined4 *)(pdVar3 + uVar12 * 4);
        local_4038[lVar22] = (uint)uVar19;
        uVar11 = uVar11 + 1;
      }
      lVar22 = lVar22 + 1;
    } while ((uVar11 < count) && (uVar8 < uVar20));
  }
  if (uVar11 < count) {
    psVar6 = pSVar5->sel_vector;
    do {
      uVar12 = uVar11;
      if (psVar4 != (sel_t *)0x0) {
        uVar12 = (ulong)psVar4[uVar11];
      }
      uVar19 = uVar12;
      if (psVar6 != (sel_t *)0x0) {
        uVar19 = (ulong)psVar6[uVar12];
      }
      rVar7 = ids[uVar12];
      local_2038[lVar22] = *(undefined4 *)(pdVar3 + uVar19 * 4);
      local_4038[lVar22] = (int)rVar7 - (int)lVar18;
      lVar22 = lVar22 + 1;
      uVar11 = uVar11 + 1;
    } while (count != uVar11);
  }
  lVar18 = uVar20 - uVar8;
  if (uVar8 <= uVar20 && lVar18 != 0) {
    switchD_015de399::default
              (local_2038 + lVar22,(void *)((long)&base_info[1].segment + uVar15 * 4 + uVar8 * 4),
               lVar18 * 4);
    switchD_015de399::default
              (local_4038 + lVar22,(void *)((long)&base_info[1].segment + uVar8 * 4),lVar18 * 4);
    lVar22 = lVar22 + lVar18;
  }
  base_info->N = (sel_t)lVar22;
  switchD_015de399::default(__dest_00,local_2038,lVar22 << 2);
  switchD_015de399::default(__dest,local_4038,lVar22 << 2);
  return;
}

Assistant:

static void MergeUpdateLoop(UpdateInfo &base_info, Vector &base_data, UpdateInfo &update_info,
                            UnifiedVectorFormat &update, row_t *ids, idx_t count, const SelectionVector &sel) {
	auto base_table_data = FlatVector::GetData<T>(base_data);
	auto update_vector_data = update.GetData<T>(update);
	MergeUpdateLoopInternal<T, T>(base_info, base_table_data, update_info, *update.sel, update_vector_data, ids, count,
	                              sel);
}